

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.h
# Opt level: O0

void __thiscall
ZAP::ArchiveBuilder::Entry::Entry(Entry *this,string *real_path,string *virtual_path)

{
  string *virtual_path_local;
  string *real_path_local;
  Entry *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)real_path);
  std::__cxx11::string::string((string *)&this->virtual_path,(string *)virtual_path);
  return;
}

Assistant:

Entry(const std::string &real_path, const std::string &virtual_path)
				: real_path(real_path), virtual_path(virtual_path) {}